

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderVertexSpacing::verifyEdges
          (TessellationShaderVertexSpacing *this,_tess_edges *edges,_run *run)

{
  ostringstream *poVar1;
  _tessellation_shader_vertex_spacing _Var2;
  pointer p_Var3;
  TessellationShaderVertexSpacing *pTVar4;
  ulong uVar5;
  pointer p_Var6;
  MessageBuilder *pMVar7;
  TestError *pTVar8;
  _tessellation_shader_vertex_spacing vertex_spacing;
  uint uVar9;
  ulong uVar10;
  pointer p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float edge_clamped_rounded_tess_level;
  float local_22c;
  TessellationShaderVertexSpacing *local_228;
  float outermost_edge_tess_level_clamped_rounded;
  _tess_coordinate_deltas segment_deltas;
  float edge_clamped_tess_level;
  string vertex_spacing_string;
  string primitive_mode_string;
  undefined1 local_1b0 [8];
  ostringstream local_1a8 [376];
  
  local_228 = this;
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            (&primitive_mode_string,(TessellationShaderUtils *)(ulong)run->primitive_mode,
             (_tessellation_primitive_mode)run);
  TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
            (&vertex_spacing_string,(TessellationShaderUtils *)(ulong)run->vertex_spacing,
             vertex_spacing);
  p_Var11 = (edges->
            super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_22c = 0.0;
  do {
    pTVar4 = local_228;
    if (p_Var11 ==
        (edges->
        super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_edge,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_edge>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::~string((string *)&vertex_spacing_string);
      std::__cxx11::string::~string((string *)&primitive_mode_string);
      return;
    }
    edge_clamped_tess_level = 0.0;
    edge_clamped_rounded_tess_level = 0.0;
    outermost_edge_tess_level_clamped_rounded = 0.0;
    segment_deltas.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    segment_deltas.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    segment_deltas.
    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
              (run->vertex_spacing,p_Var11->outermost_tess_level,
               local_228->m_gl_max_tess_gen_level_value,(float *)0x0,
               &outermost_edge_tess_level_clamped_rounded);
    TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
              (run->vertex_spacing,p_Var11->tess_level,pTVar4->m_gl_max_tess_gen_level_value,
               &edge_clamped_tess_level,&edge_clamped_rounded_tess_level);
    uVar10 = (long)(p_Var11->points).
                   super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(p_Var11->points).
                   super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if ((uVar10 & 0x7fffffff0) != 0) {
      uVar5 = 0;
LAB_00caf8d7:
      if (uVar5 != (int)(uVar10 >> 3) - 1) {
        p_Var3 = (p_Var11->points).
                 super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_cartesian>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        fVar12 = p_Var3[uVar5].x - p_Var3[uVar5 + 1].x;
        fVar13 = p_Var3[uVar5].y - p_Var3[uVar5 + 1].y;
        fVar12 = SQRT(fVar12 * fVar12 + fVar13 * fVar13);
        for (p_Var6 = segment_deltas.
                      super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            p_Var6 != segment_deltas.
                      super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                      ._M_impl.super__Vector_impl_data._M_finish; p_Var6 = p_Var6 + 1) {
          fVar14 = p_Var6->delta - fVar12;
          fVar13 = -fVar14;
          if (-fVar14 <= fVar14) {
            fVar13 = fVar14;
          }
          if (fVar13 < 0.001) {
            p_Var6->counter = p_Var6->counter + 1;
            uVar5 = uVar5 + 1;
            goto LAB_00caf8d7;
          }
        }
        local_1b0._4_4_ = fVar12;
        local_1b0._0_4_ = 1;
        std::
        vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
        ::push_back((vector<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                     *)&segment_deltas.
                        super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                    ,(value_type *)local_1b0);
        uVar5 = uVar5 + 1;
        goto LAB_00caf8d7;
      }
      _Var2 = run->vertex_spacing;
      if (_Var2 - TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN < 2) {
        if (0x10 < (ulong)((long)segment_deltas.
                                 super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)segment_deltas.
                                super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          local_1b0 = (undefined1  [8])
                      ((local_228->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                      m_log;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::operator<<((ostream *)local_1a8,"More than two segment deltas (");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::operator<<((ostream *)local_1a8,
                          ") were generated for the following tessellation configuration: primitive mode:"
                         );
          std::operator<<((ostream *)local_1a8,(string *)&primitive_mode_string);
          std::operator<<((ostream *)local_1a8,"vertex spacing mode:");
          std::operator<<((ostream *)local_1a8,(string *)&vertex_spacing_string);
          std::operator<<((ostream *)local_1a8,"inner tessellation levels: (");
          pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,run->inner);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->inner + 1);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          "), outer tessellation levels: (");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 1);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 2);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 3);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,
                     "Fractional spacing mode tessellated edges to segments of more than two differentiable lengths"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                     ,0x4fc);
          goto LAB_00cb0547;
        }
        if ((long)segment_deltas.
                  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)segment_deltas.
                  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                  ._M_impl.super__Vector_impl_data._M_start == 8) {
          if (run->primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) {
            uVar9 = (int)outermost_edge_tess_level_clamped_rounded + ((uint)local_22c / 3) * -2;
          }
          else {
            uVar9 = (uint)local_22c >> 1 & 0xfffffffe;
            if (_Var2 != TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD ||
                run->primitive_mode != TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS) {
              uVar9 = 0;
            }
            if (p_Var11->tess_level <= 0.0) {
              uVar9 = 1;
            }
            else {
              uVar9 = (int)edge_clamped_rounded_tess_level - uVar9;
            }
          }
          if ((segment_deltas.
               super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
               ._M_impl.super__Vector_impl_data._M_start)->counter != uVar9) {
            local_1b0 = (undefined1  [8])
                        ((local_228->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                        m_log;
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::operator<<((ostream *)local_1a8,"Invalid amount of segments (expected:");
            std::ostream::operator<<(local_1a8,uVar9);
            std::operator<<((ostream *)local_1a8,", found: ");
            pMVar7 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_1b0,
                                &(segment_deltas.
                                  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->counter);
            poVar1 = &pMVar7->m_str;
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            ") was generated for the following tessellation configuration: primitive mode:"
                           );
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            (string *)&primitive_mode_string);
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            "vertex spacing mode:");
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            (string *)&vertex_spacing_string);
            std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                            "inner tessellation levels: (");
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->inner);
            std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", "
                           );
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->inner + 1);
            std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            "), outer tessellation levels: (");
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer);
            std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", "
                           );
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 1);
            std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", "
                           );
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 2);
            std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", "
                           );
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 3);
            std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")")
            ;
            tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,
                       "Invalid amount of segments generated for fractional vertex spacing mode",
                       (char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                       ,0x528);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
        }
        else if ((((segment_deltas.
                    super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                    ._M_impl.super__Vector_impl_data._M_start)->counter != 2) ||
                 (segment_deltas.
                  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].counter !=
                  (int)(long)edge_clamped_rounded_tess_level - 2U)) &&
                ((segment_deltas.
                  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].counter != 2 ||
                 ((segment_deltas.
                   super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                   ._M_impl.super__Vector_impl_data._M_start)->counter !=
                  (int)(long)edge_clamped_rounded_tess_level - 2U)))) {
          local_1b0 = (undefined1  [8])
                      ((local_228->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                      m_log;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::operator<<((ostream *)local_1a8,"Invalid number of segments with different deltas (")
          ;
          pMVar7 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_1b0,
                              &(segment_deltas.
                                super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                ._M_impl.super__Vector_impl_data._M_start)->delta);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          " and ");
          pMVar7 = tcu::MessageBuilder::operator<<
                             (pMVar7,&segment_deltas.
                                      super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1].delta);
          poVar1 = &pMVar7->m_str;
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          ") was generated. primitive mode:");
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          (string *)&primitive_mode_string);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "vertex spacing mode:");
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          (string *)&vertex_spacing_string);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "inner tessellation levels: (");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->inner);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->inner + 1);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          "), outer tessellation levels: (");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 1);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 2);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 3);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,
                     "Equal amount of segments was generated for segments of different deltas",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                     ,0x53f);
          goto LAB_00cb0547;
        }
      }
      else {
        if ((_Var2 != TESSELLATION_SHADER_VERTEX_SPACING_EQUAL) &&
           (_Var2 != TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT)) {
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,"Unrecognized vertex spacing mode",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                     ,0x559);
LAB_00cb0547:
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        if ((long)segment_deltas.
                  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)segment_deltas.
                  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                  ._M_impl.super__Vector_impl_data._M_start != 8) {
          local_1b0 = (undefined1  [8])
                      ((local_228->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                      m_log;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::operator<<((ostream *)local_1a8,
                          "More than one segment delta was generated for the following tessellation configuration: primitive mode:"
                         );
          std::operator<<((ostream *)local_1a8,(string *)&primitive_mode_string);
          std::operator<<((ostream *)local_1a8,"vertex spacing mode:");
          std::operator<<((ostream *)local_1a8,(string *)&vertex_spacing_string);
          std::operator<<((ostream *)local_1a8,"inner tessellation levels: (");
          pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,run->inner);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->inner + 1);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          "), outer tessellation levels: (");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 1);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 2);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 3);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,
                     "Equal vertex spacing mode tessellation generated segment edges of varying lengths, whereas only one was expected."
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                     ,0x4b2);
LAB_00cafde6:
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        fVar14 = p_Var11->edge_length / edge_clamped_rounded_tess_level;
        fVar13 = (segment_deltas.
                  super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                  ._M_impl.super__Vector_impl_data._M_start)->delta - fVar14;
        fVar12 = -fVar13;
        if (-fVar13 <= fVar13) {
          fVar12 = fVar13;
        }
        if (0.001 < fVar12) {
          local_1b0 = (undefined1  [8])
                      ((local_228->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                      m_log;
          local_22c = fVar14;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::operator<<((ostream *)local_1a8,"Invalid segment delta (expected:");
          std::ostream::operator<<(local_1a8,local_22c);
          std::operator<<((ostream *)local_1a8,", found: ");
          pMVar7 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_1b0,
                              &(segment_deltas.
                                super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                ._M_impl.super__Vector_impl_data._M_start)->delta);
          poVar1 = &pMVar7->m_str;
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          ") was generated for the following tessellation configuration: primitive mode:"
                         );
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          (string *)&primitive_mode_string);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "vertex spacing mode:");
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          (string *)&vertex_spacing_string);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "inner tessellation levels: (");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->inner);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->inner + 1);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          "), outer tessellation levels: (");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 1);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 2);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 3);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,
                     "Invalid delta between segments generated by the tessellator configured to run in equal vertex spacing mode"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                     ,0x4c3);
          goto LAB_00cafde6;
        }
        if ((segment_deltas.
             super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
             ._M_impl.super__Vector_impl_data._M_start)->counter !=
            (uint)(long)edge_clamped_rounded_tess_level) {
          local_1b0 = (undefined1  [8])
                      ((local_228->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                      m_log;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::operator<<((ostream *)local_1a8,"Invalid amount of segments (expected:");
          std::ostream::operator<<(local_1a8,(int)edge_clamped_rounded_tess_level);
          std::operator<<((ostream *)local_1a8,", found: ");
          pMVar7 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_1b0,
                              &(segment_deltas.
                                super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                                ._M_impl.super__Vector_impl_data._M_start)->counter);
          poVar1 = &pMVar7->m_str;
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          ") was generated for the following tessellation configuration: primitive mode:"
                         );
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          (string *)&primitive_mode_string);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "vertex spacing mode:");
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          (string *)&vertex_spacing_string);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "inner tessellation levels: (");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->inner);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->inner + 1);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          "), outer tessellation levels: (");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 1);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 2);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,run->outer + 3);
          std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,"Invalid amount of segments generated for equal vertex spacing mode",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                     ,0x4d5);
          goto LAB_00cafde6;
        }
      }
    }
    std::
    _Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
    ::~_Vector_base(&segment_deltas.
                     super__Vector_base<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta,_std::allocator<glcts::TessellationShaderVertexSpacing::_tess_coordinate_delta>_>
                   );
    p_Var11 = p_Var11 + 1;
    local_22c = (float)((int)local_22c + 1);
  } while( true );
}

Assistant:

void TessellationShaderVertexSpacing::verifyEdges(const _tess_edges& edges, const _run& run)
{
	/* Cache strings that may be used by logging the routines */
	const std::string primitive_mode_string = TessellationShaderUtils::getESTokenForPrimitiveMode(run.primitive_mode);
	const std::string vertex_spacing_string =
		TessellationShaderUtils::getESTokenForVertexSpacingMode(run.vertex_spacing);

	/* Iterate through all edges */
	unsigned int n_edge = 0;

	for (_tess_edges_const_iterator edges_iterator = edges.begin(); edges_iterator != edges.end();
		 edges_iterator++, n_edge++)
	{
		const _tess_edge&		edge									  = *edges_iterator;
		float					edge_clamped_tess_level					  = 0.0f;
		float					edge_clamped_rounded_tess_level			  = 0.0f;
		float					outermost_edge_tess_level_clamped_rounded = 0.0f;
		_tess_coordinate_deltas segment_deltas;

		TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
			run.vertex_spacing, edge.outermost_tess_level, m_gl_max_tess_gen_level_value, DE_NULL, /* out_clamped */
			&outermost_edge_tess_level_clamped_rounded);

		/* Retrieve amount of segments the edge should consist of */
		TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(
			run.vertex_spacing, edge.tess_level, m_gl_max_tess_gen_level_value, &edge_clamped_tess_level,
			&edge_clamped_rounded_tess_level);

		/* Take two subsequent points if they are available. Vertex spacing has no meaning
		 * in a world of degenerate edges, so skip the check if we have just encountered one.
		 */
		const unsigned int n_points = (const unsigned int)edge.points.size();

		if (n_points < 2)
		{
			continue;
		}

		/* Compute segment deltas */
		for (unsigned int n_base_point = 0; n_base_point < n_points - 1; n_base_point++)
		{
			const _tess_coordinate_cartesian& point_a = edge.points[n_base_point + 0];
			const _tess_coordinate_cartesian& point_b = edge.points[n_base_point + 1];

			/* Calculate the distance between the points */
			float distance_nonsqrt = 0.0f;
			float distance		   = 0.0f;

			distance_nonsqrt =
				(point_a.x - point_b.x) * (point_a.x - point_b.x) + (point_a.y - point_b.y) * (point_a.y - point_b.y);

			distance = deFloatSqrt(distance_nonsqrt);

			/* Check if the distance is not already recognized. */
			_tess_coordinate_deltas_iterator deltas_iterator;

			for (deltas_iterator = segment_deltas.begin(); deltas_iterator != segment_deltas.end(); deltas_iterator++)
			{
				if (de::abs(deltas_iterator->delta - distance) < epsilon)
				{
					/* Increment the counter and leave */
					deltas_iterator->counter++;

					break;
				}
			}

			if (deltas_iterator == segment_deltas.end())
			{
				/* This is the first time we're encountering a segment of this specific length. */
				_tess_coordinate_delta new_item;

				new_item.counter = 1;
				new_item.delta   = distance;

				segment_deltas.push_back(new_item);
			}
		} /* for (all base points) */

		DE_ASSERT(segment_deltas.size() != 0);

		switch (run.vertex_spacing)
		{
		case TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT:
		case TESSELLATION_SHADER_VERTEX_SPACING_EQUAL:
		{
			/* For equal vertex spacings, we should end up with a single _tess_coordinate_delta instance
			 * of a predefined length, describing exactly edge_clamped_rounded_tess_level invocations */
			float expected_delta = edge.edge_length / edge_clamped_rounded_tess_level;

			if (segment_deltas.size() != 1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << "More than one segment delta was generated for the following tessellation"
									  " configuration: "
									  "primitive mode:"
								   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
								   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
								   << ")"
									  ", outer tessellation levels: ("
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

				TCU_FAIL("Equal vertex spacing mode tessellation generated segment edges of varying lengths, "
						 "whereas only one was expected.");
			}

			if (de::abs(segment_deltas[0].delta - expected_delta) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid segment delta (expected:" << expected_delta
								   << ", found: " << segment_deltas[0].delta
								   << ") was generated for the following tessellation configuration: "
									  "primitive mode:"
								   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
								   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
								   << ")"
									  ", outer tessellation levels: ("
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid delta between segments generated by the tessellator configured to run "
						 "in equal vertex spacing mode");
			}

			if (segment_deltas[0].counter != (unsigned int)edge_clamped_rounded_tess_level)
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << "Invalid amount of segments (expected:" << (int)edge_clamped_rounded_tess_level
								   << ", found: " << segment_deltas[0].counter
								   << ") "
									  "was generated for the following tessellation configuration: "
									  "primitive mode:"
								   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
								   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
								   << ")"
									  ", outer tessellation levels: ("
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid amount of segments generated for equal vertex spacing mode");
			}

			break;
		} /* default/equal vertex spacing */

		case TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN:
		case TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD:
		{
			/* For fractional vertex spacings, situation is more tricky. The extension specification
			 * is very liberal when it comes to defining segment lengths. Hence the only thing we
			 * should be testing here is that:
			 *
			 * a) No more than 2 deltas are generated for a single edge.
			 *
			 * b) If a single delta is generated, it should:
			 *
			 *    1. define exactly edge_clamped_rounded_tess_level-2 segments if
			 *    |edge_clamped_rounded_tess_level - edge_clamped_tess_level| == 2.0f,
			 *
			 *    2. define exactly edge_clamped_rounded_tess_level segments otherwise.
			 *
			 * c) If two deltas are generated, one of them should define 2 segments, and the other
			 *    one should define edge_clamped_rounded_tess_level-2 segments.
			 */

			if (segment_deltas.size() > 2)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "More than two segment deltas (" << segment_deltas.size()
								   << ") were generated for the following tessellation configuration: "
									  "primitive mode:"
								   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
								   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
								   << ")"
									  ", outer tessellation levels: ("
								   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
								   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

				TCU_FAIL("Fractional spacing mode tessellated edges to segments of more than two "
						 "differentiable lengths");
			}

			if (segment_deltas.size() == 1)
			{
				int expected_counter = 0;

				if (run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
				{
					/* With each triangle level, 2 segments go out. Each triangle consists of 3 edges */
					expected_counter = (int)outermost_edge_tess_level_clamped_rounded - 2 * (n_edge / 3);
				}
				else
				{
					expected_counter = (int)edge_clamped_rounded_tess_level;
					if (run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS &&
						run.vertex_spacing == TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD)
					{
						/* 8 edges expected in total; we should expect 2 segments less for the inner quad */
						expected_counter = (int)edge_clamped_rounded_tess_level - 2 * (n_edge / 4);
					}

					/* For degenerate cases, always assume exactly one segment should be generated */
					if (edge.tess_level <= 0.0f)
					{
						expected_counter = 1;
					}
				}

				if (segment_deltas[0].counter != (unsigned int)expected_counter)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Invalid amount of segments (expected:" << expected_counter
									   << ", found: " << segment_deltas[0].counter
									   << ") "
										  "was generated for the following tessellation configuration: "
										  "primitive mode:"
									   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
									   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
									   << ")"
										  ", outer tessellation levels: ("
									   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
									   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

					TCU_FAIL("Invalid amount of segments generated for fractional vertex spacing mode");
				}
			}
			else
			{
				DE_ASSERT(segment_deltas.size() == 2);

				if (!((segment_deltas[0].counter == 2 &&
					   segment_deltas[1].counter == ((unsigned int)edge_clamped_rounded_tess_level - 2)) ||
					  (segment_deltas[1].counter == 2 &&
					   segment_deltas[0].counter == ((unsigned int)edge_clamped_rounded_tess_level - 2))))
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid number of segments with different deltas ("
									   << segment_deltas[0].delta << " and " << segment_deltas[1].delta
									   << ") was generated. "
										  "primitive mode:"
									   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
									   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
									   << ")"
										  ", outer tessellation levels: ("
									   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
									   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

					TCU_FAIL("Equal amount of segments was generated for segments of different deltas");
				}

				if (segment_deltas[0].counter != 2 && segment_deltas[1].counter != 2)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "Neither of the segments generated by the tessellator was defined "
										  "exactly twice."
										  "primitive mode:"
									   << primitive_mode_string << "vertex spacing mode:" << vertex_spacing_string
									   << "inner tessellation levels: (" << run.inner[0] << ", " << run.inner[1]
									   << ")"
										  ", outer tessellation levels: ("
									   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
									   << run.outer[3] << ")" << tcu::TestLog::EndMessage;

					TCU_FAIL("Neither of the generated segments was repeated exactly twice "
							 "for fractional vertex spacing mode");
				}
			}

			break;
		} /* fractional even/odd vertex spacing types */

		default:
		{
			TCU_FAIL("Unrecognized vertex spacing mode");
		}
		} /* switch (run.vertex_spacing) */
	}	 /* for (all edges) */
}